

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  StringRef ref;
  StringRef ref_00;
  int iVar1;
  StringRef name;
  StringRef name_00;
  StringRef SVar2;
  size_type in_stack_ffffffffffffff98;
  ScopedElement local_60;
  pointer local_50 [4];
  ScopedElement e;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"OverallResult",(allocator<char> *)&local_60);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)local_50);
  std::__cxx11::string::~string((string *)local_50);
  SVar2.m_size = 7;
  SVar2.m_start = "success";
  XmlWriter::writeAttribute(e.m_writer,SVar2,(testCaseStats->totals).assertions.failed == 0);
  name.m_size = 5;
  name.m_start = "skips";
  XmlWriter::writeAttribute<unsigned_long,void>
            (e.m_writer,name,&(testCaseStats->totals).assertions.skipped);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    local_50[0] = (pointer)Timer::getElapsedSeconds(&this->m_testCaseTimer);
    name_00.m_size = 0x11;
    name_00.m_start = "durationInSeconds";
    XmlWriter::writeAttribute<double,void>(e.m_writer,name_00,(double *)local_50);
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"StdOut",(allocator<char> *)&stack0xffffffffffffff9f);
    XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_00,(XmlFormatting)local_50);
    ref.m_size = in_stack_ffffffffffffff98;
    ref.m_start = (char *)0x134d79;
    SVar2 = trim(ref);
    XmlWriter::writeText(local_60.m_writer,SVar2,Newline);
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"StdErr",(allocator<char> *)&stack0xffffffffffffff9f);
    XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_00,(XmlFormatting)local_50);
    ref_00.m_size = in_stack_ffffffffffffff98;
    ref_00.m_start = (char *)0x134ddc;
    SVar2 = trim(ref_00);
    XmlWriter::writeText(local_60.m_writer,SVar2,Newline);
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    std::__cxx11::string::~string((string *)local_50);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success"_sr, testCaseStats.totals.assertions.allOk() );
        e.writeAttribute( "skips"_sr, testCaseStats.totals.assertions.skipped );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds"_sr, m_testCaseTimer.getElapsedSeconds() );
        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( StringRef(testCaseStats.stdOut) ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( StringRef(testCaseStats.stdErr) ), XmlFormatting::Newline );

        m_xml.endElement();
    }